

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::FastSearchLoop(DFA *this,SearchParams *params)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  code *local_38;
  int index;
  bool have_firstbyte;
  SearchParams *params_local;
  DFA *this_local;
  
  lVar3 = (long)(int)((params->want_earliest_match & 1) * 2 + (uint)(-1 < params->firstbyte) * 4 |
                     params->run_forward & 1);
  local_38 = (code *)FastSearchLoop::Searches[lVar3 * 2];
  plVar2 = (long *)((long)&this->prog_ + FastSearchLoop::Searches[lVar3 * 2 + 1]);
  if (((ulong)local_38 & 1) != 0) {
    local_38 = *(code **)(local_38 + *plVar2 + -1);
  }
  bVar1 = (*local_38)(plVar2,params);
  return (bool)(bVar1 & 1);
}

Assistant:

bool DFA::FastSearchLoop(SearchParams* params) {
  // Because the methods are private, the Searches array
  // cannot be declared at top level.
  static bool (DFA::*Searches[])(SearchParams*) = {
    &DFA::SearchFFF,
    &DFA::SearchFFT,
    &DFA::SearchFTF,
    &DFA::SearchFTT,
    &DFA::SearchTFF,
    &DFA::SearchTFT,
    &DFA::SearchTTF,
    &DFA::SearchTTT,
  };

  bool have_firstbyte = (params->firstbyte >= 0);
  int index = 4 * have_firstbyte +
              2 * params->want_earliest_match +
              1 * params->run_forward;
  return (this->*Searches[index])(params);
}